

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

int tcu::getChannelSize(ChannelType type)

{
  int local_c;
  ChannelType type_local;
  
  switch(type) {
  case SNORM_INT8:
    local_c = 1;
    break;
  case SNORM_INT16:
    local_c = 2;
    break;
  case SNORM_INT32:
    local_c = 4;
    break;
  case UNORM_INT8:
    local_c = 1;
    break;
  case UNORM_INT16:
    local_c = 2;
    break;
  case UNORM_INT24:
    local_c = 3;
    break;
  case UNORM_INT32:
    local_c = 4;
    break;
  default:
    local_c = 0;
    break;
  case SIGNED_INT8:
    local_c = 1;
    break;
  case SIGNED_INT16:
    local_c = 2;
    break;
  case SIGNED_INT32:
    local_c = 4;
    break;
  case UNSIGNED_INT8:
    local_c = 1;
    break;
  case UNSIGNED_INT16:
    local_c = 2;
    break;
  case UNSIGNED_INT24:
    local_c = 3;
    break;
  case UNSIGNED_INT32:
    local_c = 4;
    break;
  case HALF_FLOAT:
    local_c = 2;
    break;
  case FLOAT:
    local_c = 4;
    break;
  case FLOAT64:
    local_c = 8;
  }
  return local_c;
}

Assistant:

int getChannelSize (TextureFormat::ChannelType type)
{
	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (type)
	{
		case TextureFormat::SNORM_INT8:			return 1;
		case TextureFormat::SNORM_INT16:		return 2;
		case TextureFormat::SNORM_INT32:		return 4;
		case TextureFormat::UNORM_INT8:			return 1;
		case TextureFormat::UNORM_INT16:		return 2;
		case TextureFormat::UNORM_INT24:		return 3;
		case TextureFormat::UNORM_INT32:		return 4;
		case TextureFormat::SIGNED_INT8:		return 1;
		case TextureFormat::SIGNED_INT16:		return 2;
		case TextureFormat::SIGNED_INT32:		return 4;
		case TextureFormat::UNSIGNED_INT8:		return 1;
		case TextureFormat::UNSIGNED_INT16:		return 2;
		case TextureFormat::UNSIGNED_INT24:		return 3;
		case TextureFormat::UNSIGNED_INT32:		return 4;
		case TextureFormat::HALF_FLOAT:			return 2;
		case TextureFormat::FLOAT:				return 4;
		case TextureFormat::FLOAT64:			return 8;
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}